

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::SimpleSystemSubroutine::bindArgument
          (SimpleSystemSubroutine *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax
          ,Args *args)

{
  pointer ppTVar1;
  int iVar2;
  Expression *pEVar3;
  undefined4 extraout_var;
  ulong uVar4;
  
  uVar4 = argIndex - this->isMethod;
  ppTVar1 = (this->argTypes).
            super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)((long)(this->argTypes).
                            super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3)) {
    pEVar3 = Expression::bindArgument
                       (ppTVar1[uVar4],In,(bitmask<slang::ast::VariableFlags>)0x0,syntax,context);
    return pEVar3;
  }
  iVar2 = Expression::bind((int)syntax,(sockaddr *)context,0);
  return (Expression *)CONCAT44(extraout_var,iVar2);
}

Assistant:

const Expression& SimpleSystemSubroutine::bindArgument(size_t argIndex, const ASTContext& context,
                                                       const ExpressionSyntax& syntax,
                                                       const Args& args) const {
    if (isMethod)
        argIndex--;

    if (argIndex >= argTypes.size())
        return SystemSubroutine::bindArgument(argIndex, context, syntax, args);

    return Expression::bindArgument(*argTypes[argIndex], ArgumentDirection::In, {}, syntax,
                                    context);
}